

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O2

uint16_t __thiscall jbcoin::SerialIter::get16(SerialIter *this)

{
  ushort uVar1;
  ushort *puVar2;
  
  if (1 < this->remain_) {
    puVar2 = (ushort *)this->p_;
    this->p_ = (uint8_t *)(puVar2 + 1);
    this->used_ = this->used_ + 2;
    this->remain_ = this->remain_ - 2;
    uVar1 = *puVar2;
    return uVar1 << 8 | uVar1 >> 8;
  }
  Throw<std::runtime_error,char_const(&)[25]>((char (*) [25])"invalid SerialIter get16");
}

Assistant:

std::uint16_t
SerialIter::get16()
{
    if (remain_ < 2)
        Throw<std::runtime_error> (
            "invalid SerialIter get16");
    auto t = p_;
    p_ += 2;
    used_ += 2;
    remain_ -= 2;
    return
        (std::uint64_t(t[0]) <<  8) +
         std::uint64_t(t[1]  );
}